

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::CheckOpcode3
          (TypeChecker *this,Opcode opcode,Limits *limits1,Limits *limits2,Limits *limits3)

{
  bool bVar1;
  Type TVar2;
  Type expected2;
  Type expected3;
  Result RVar3;
  char *desc;
  Opcode opcode_local;
  
  bVar1 = (limits1 != (Limits *)0x0 || limits2 != (Limits *)0x0) || limits3 != (Limits *)0x0;
  TVar2 = Opcode::GetParamType1(&opcode_local);
  if ((limits1 != (Limits *)0x0) && ((limits1->is_64 & bVar1) != 0)) {
    TVar2.enum_ = I64;
  }
  expected2 = Opcode::GetParamType2(&opcode_local);
  if ((limits2 != (Limits *)0x0) && ((limits2->is_64 & bVar1) != 0)) {
    expected2.enum_ = I64;
  }
  expected3 = Opcode::GetParamType3(&opcode_local);
  if ((limits3 != (Limits *)0x0) && ((limits3->is_64 & bVar1) != 0)) {
    expected3.enum_ = I64;
  }
  desc = Opcode::GetName(&opcode_local);
  RVar3 = PopAndCheck3Types(this,TVar2,expected2,expected3,desc);
  TVar2 = Opcode::GetResultType(&opcode_local);
  PushType(this,TVar2);
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode,
                                 const Limits* limits1,
                                 const Limits* limits2,
                                 const Limits* limits3) {
  bool has_address_operands = limits1 || limits2 || limits3;
  Result result =
      PopAndCheck3Types(opcode.GetMemoryParam(opcode.GetParamType1(), limits1,
                                              has_address_operands),
                        opcode.GetMemoryParam(opcode.GetParamType2(), limits2,
                                              has_address_operands),
                        opcode.GetMemoryParam(opcode.GetParamType3(), limits3,
                                              has_address_operands),
                        opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}